

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O0

CloudNode * Lpk_CutTruthBdd_rec(CloudManager *dd,Hop_Man_t *pMan,Hop_Obj_t *pObj,int nVars)

{
  int iVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  CloudNode *pCVar4;
  CloudNode *pCVar5;
  CloudNode *pTruth1;
  CloudNode *pTruth0;
  CloudNode *pTruth;
  int nVars_local;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *pMan_local;
  CloudManager *dd_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                  ,0x31,
                  "CloudNode *Lpk_CutTruthBdd_rec(CloudManager *, Hop_Man_t *, Hop_Obj_t *, int)");
  }
  if ((pObj->field_0).pData == (void *)0x0) {
    iVar1 = Hop_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      iVar1 = Hop_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Hop_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                      ,0x3c,
                      "CloudNode *Lpk_CutTruthBdd_rec(CloudManager *, Hop_Man_t *, Hop_Obj_t *, int)"
                     );
      }
      pHVar3 = Hop_ObjFanin0(pObj);
      pCVar4 = Lpk_CutTruthBdd_rec(dd,pMan,pHVar3,nVars);
      pHVar3 = Hop_ObjFanin1(pObj);
      pCVar5 = Lpk_CutTruthBdd_rec(dd,pMan,pHVar3,nVars);
      iVar1 = Hop_ObjFaninC0(pObj);
      iVar2 = Hop_ObjFaninC1(pObj);
      pTruth0 = Cloud_bddAnd(dd,(CloudNode *)((ulong)pCVar4 ^ (long)iVar1),
                             (CloudNode *)((ulong)pCVar5 ^ (long)iVar2));
    }
    else {
      pTruth0 = dd->one;
    }
    (pObj->field_0).pData = pTruth0;
    dd_local = (CloudManager *)pTruth0;
  }
  else {
    if (((ulong)(pObj->field_0).pData & 0xffff0000) == 0) {
      __assert_fail("((unsigned)(ABC_PTRUINT_T)pObj->pData) & 0xffff0000",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                    ,0x34,
                    "CloudNode *Lpk_CutTruthBdd_rec(CloudManager *, Hop_Man_t *, Hop_Obj_t *, int)")
      ;
    }
    dd_local = (CloudManager *)(pObj->field_0).pData;
  }
  return (CloudNode *)dd_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes the truth table of one cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
CloudNode * Lpk_CutTruthBdd_rec( CloudManager * dd, Hop_Man_t * pMan, Hop_Obj_t * pObj, int nVars )
{
    CloudNode * pTruth, * pTruth0, * pTruth1;
    assert( !Hop_IsComplement(pObj) );
    if ( pObj->pData )
    {
        assert( ((unsigned)(ABC_PTRUINT_T)pObj->pData) & 0xffff0000 );
        return (CloudNode *)pObj->pData;
    }
    // get the plan for a new truth table
    if ( Hop_ObjIsConst1(pObj) )
        pTruth = dd->one;
    else
    {
        assert( Hop_ObjIsAnd(pObj) );
        // compute the truth tables of the fanins
        pTruth0 = Lpk_CutTruthBdd_rec( dd, pMan, Hop_ObjFanin0(pObj), nVars );
        pTruth1 = Lpk_CutTruthBdd_rec( dd, pMan, Hop_ObjFanin1(pObj), nVars );
        pTruth0 = Cloud_NotCond( pTruth0, Hop_ObjFaninC0(pObj) );
        pTruth1 = Cloud_NotCond( pTruth1, Hop_ObjFaninC1(pObj) );
        // creat the truth table of the node
        pTruth = Cloud_bddAnd( dd, pTruth0, pTruth1 );
    }
    pObj->pData = pTruth;
    return pTruth;
}